

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Shader *shader,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  PrimMeta *this_00;
  value_type *this_01;
  value_type *this_02;
  value_type *this_03;
  value_type *this_04;
  value_type *shader_00;
  value_type *this_05;
  value_type *this_06;
  value_type *this_07;
  value_type *this_08;
  value_type *this_09;
  value_type *this_10;
  value_type *this_11;
  tinyusdz *this_12;
  uint32_t indent_00;
  string *psVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  undefined1 auVar4 [12];
  string sStack_1e768;
  string sStack_1e748;
  string sStack_1e728;
  optional<tinyusdz::ShaderNode> oStack_1e708;
  undefined1 auStack_1dfd0 [8];
  optional<tinyusdz::ShaderNode> pvsn;
  optional<tinyusdz::UsdPreviewSurface> oStack_1d878;
  undefined1 auStack_1a930 [8];
  optional<tinyusdz::UsdPreviewSurface> pvs;
  optional<tinyusdz::UsdTransform2d> oStack_179c8;
  undefined1 auStack_16610 [8];
  optional<tinyusdz::UsdTransform2d> pvtx2d;
  optional<tinyusdz::UsdUVTexture> oStack_15238;
  undefined1 auStack_12c50 [8];
  optional<tinyusdz::UsdUVTexture> pvtex;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> oStack_10648;
  undefined1 local_f780 [8];
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> pvrm;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> local_e898;
  undefined1 local_da48 [8];
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> pvrp;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> local_cbd8;
  undefined1 local_bd88 [8];
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> pvrv;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> local_af18;
  undefined1 local_a0c8 [8];
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> pvrn;
  optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9258;
  undefined1 local_83f0 [8];
  optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvrs;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> local_7568;
  undefined1 local_6710 [8];
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> pvr4;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> local_5898;
  undefined1 local_4a48 [8];
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> pvr3;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> local_3bd8;
  undefined1 local_2d88 [8];
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> pvr2;
  optional<tinyusdz::UsdPrimvarReader<float>_> local_1f18;
  undefined1 local_10d0 [8];
  optional<tinyusdz::UsdPrimvarReader<float>_> pvr;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  UsdShadePrim *pUStack_18;
  uint32_t indent_local;
  Shader *shader_local;
  
  local_1c = (uint)shader;
  local_1d = (byte)indent & 1;
  psVar3 = __return_storage_ptr__;
  pUStack_18 = (UsdShadePrim *)this;
  shader_local = (Shader *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar3;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)pUStack_18->spec,s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," Shader \"");
  poVar2 = ::std::operator<<(poVar2,(string *)pUStack_18);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&pUStack_18->meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    this_00 = UsdShadePrim::metas(pUStack_18);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)this_00,(PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  auVar4 = ::std::__cxx11::string::size();
  if (auVar4._0_8_ != 0) {
    pprint::Indent_abi_cxx11_
              ((string *)((long)&pvr.contained + 0xe38),(pprint *)(ulong)(local_1c + 1),auVar4._8_4_
              );
    poVar2 = ::std::operator<<(aoStack_198,(string *)((long)&pvr.contained + 0xe38));
    poVar2 = ::std::operator<<(poVar2,"uniform token info:id = \"");
    poVar2 = ::std::operator<<(poVar2,(string *)(pUStack_18 + 1));
    ::std::operator<<(poVar2,"\"\n");
    ::std::__cxx11::string::~string((string *)((long)&pvr.contained + 0xe38));
  }
  value::Value::get_value<tinyusdz::UsdPrimvarReader<float>>
            (&local_1f18,(Value *)&pUStack_18[1].spec,false);
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::
  optional<tinyusdz::UsdPrimvarReader<float>,_0>
            ((optional<tinyusdz::UsdPrimvarReader<float>_> *)local_10d0,&local_1f18);
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::~optional(&local_1f18);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_10d0);
  if (bVar1) {
    this_01 = nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::value
                        ((optional<tinyusdz::UsdPrimvarReader<float>_> *)local_10d0);
    print_shader_params_abi_cxx11_
              ((string *)((long)&pvr2.contained + 0xe40),(tinyusdz *)this_01,
               (UsdPrimvarReader_float *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)((long)&pvr2.contained + 0xe40));
    ::std::__cxx11::string::~string((string *)((long)&pvr2.contained + 0xe40));
  }
  else {
    value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
              (&local_3bd8,(Value *)&pUStack_18[1].spec,false);
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::
    optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>,_0>
              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)local_2d88,
               &local_3bd8);
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::~optional
              (&local_3bd8);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2d88);
    if (bVar1) {
      this_02 = nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::value
                          ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)
                           local_2d88);
      print_shader_params_abi_cxx11_
                ((string *)((long)&pvr3.contained + 0xe40),(tinyusdz *)this_02,
                 (UsdPrimvarReader_float2 *)(ulong)(local_1c + 1),indent_00);
      ::std::operator<<(aoStack_198,(string *)((long)&pvr3.contained + 0xe40));
      ::std::__cxx11::string::~string((string *)((long)&pvr3.contained + 0xe40));
    }
    else {
      value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                (&local_5898,(Value *)&pUStack_18[1].spec,false);
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>,_0>
                ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)local_4a48,
                 &local_5898);
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      ~optional(&local_5898);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4a48);
      if (bVar1) {
        this_03 = nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::value
                            ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)
                             local_4a48);
        print_shader_params_abi_cxx11_
                  ((string *)((long)&pvr4.contained + 0xe48),(tinyusdz *)this_03,
                   (UsdPrimvarReader_float3 *)(ulong)(local_1c + 1),indent_00);
        ::std::operator<<(aoStack_198,(string *)((long)&pvr4.contained + 0xe48));
        ::std::__cxx11::string::~string((string *)((long)&pvr4.contained + 0xe48));
      }
      else {
        value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                  (&local_7568,(Value *)&pUStack_18[1].spec,false);
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>,_0>
                  ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)local_6710,
                   &local_7568);
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        ~optional(&local_7568);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_6710);
        if (bVar1) {
          this_04 = nonstd::optional_lite::
                    optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::value
                              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)
                               local_6710);
          print_shader_params_abi_cxx11_
                    ((string *)((long)&pvrs.contained + 0xe58),(tinyusdz *)this_04,
                     (UsdPrimvarReader_float4 *)(ulong)(local_1c + 1),indent_00);
          ::std::operator<<(aoStack_198,(string *)((long)&pvrs.contained + 0xe58));
          ::std::__cxx11::string::~string((string *)((long)&pvrs.contained + 0xe58));
        }
        else {
          value::Value::get_value<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                    (&local_9258,(Value *)&pUStack_18[1].spec,false);
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                    ((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_83f0,&local_9258);
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~optional(&local_9258);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_83f0);
          if (bVar1) {
            shader_00 = nonstd::optional_lite::
                        optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::value((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_83f0);
            print_shader_params((string *)((long)&pvrn.contained + 0xe40),shader_00,local_1c + 1);
            ::std::operator<<(aoStack_198,(string *)((long)&pvrn.contained + 0xe40));
            ::std::__cxx11::string::~string((string *)((long)&pvrn.contained + 0xe40));
          }
          else {
            value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                      (&local_af18,(Value *)&pUStack_18[1].spec,false);
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>,_0>
                      ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                       local_a0c8,&local_af18);
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::~optional(&local_af18);
            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_a0c8);
            if (bVar1) {
              this_05 = nonstd::optional_lite::
                        optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>::value
                                  ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
                                    *)local_a0c8);
              print_shader_params_abi_cxx11_
                        ((string *)((long)&pvrv.contained + 0xe40),(tinyusdz *)this_05,
                         (UsdPrimvarReader_normal *)(ulong)(local_1c + 1),indent_00);
              ::std::operator<<(aoStack_198,(string *)((long)&pvrv.contained + 0xe40));
              ::std::__cxx11::string::~string((string *)((long)&pvrv.contained + 0xe40));
            }
            else {
              value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                        (&local_cbd8,(Value *)&pUStack_18[1].spec,false);
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>,_0>
                        ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         local_bd88,&local_cbd8);
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::~optional
                        (&local_cbd8);
              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_bd88)
              ;
              if (bVar1) {
                this_06 = nonstd::optional_lite::
                          optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::value
                                    ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>
                                      *)local_bd88);
                print_shader_params_abi_cxx11_
                          ((string *)((long)&pvrp.contained + 0xe40),(tinyusdz *)this_06,
                           (UsdPrimvarReader_vector *)(ulong)(local_1c + 1),indent_00);
                ::std::operator<<(aoStack_198,(string *)((long)&pvrp.contained + 0xe40));
                ::std::__cxx11::string::~string((string *)((long)&pvrp.contained + 0xe40));
              }
              else {
                value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                          (&local_e898,(Value *)&pUStack_18[1].spec,false);
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>,_0>
                          ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           local_da48,&local_e898);
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::~optional
                          (&local_e898);
                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)local_da48);
                if (bVar1) {
                  this_07 = nonstd::optional_lite::
                            optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::value
                                      ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>
                                        *)local_da48);
                  print_shader_params_abi_cxx11_
                            ((string *)((long)&pvrm.contained + 0xeb8),(tinyusdz *)this_07,
                             (UsdPrimvarReader_point *)(ulong)(local_1c + 1),indent_00);
                  ::std::operator<<(aoStack_198,(string *)((long)&pvrm.contained + 0xeb8));
                  ::std::__cxx11::string::~string((string *)((long)&pvrm.contained + 0xeb8));
                }
                else {
                  value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                            (&oStack_10648,(Value *)&pUStack_18[1].spec,false);
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>,_0>
                            ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             local_f780,&oStack_10648);
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::~optional
                            (&oStack_10648);
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)local_f780);
                  if (bVar1) {
                    this_08 = nonstd::optional_lite::
                              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::
                              value((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>
                                     *)local_f780);
                    print_shader_params_abi_cxx11_
                              ((string *)((long)&pvtex.contained + 0x25d8),(tinyusdz *)this_08,
                               (UsdPrimvarReader_matrix *)(ulong)(local_1c + 1),indent_00);
                    ::std::operator<<(aoStack_198,(string *)((long)&pvtex.contained + 0x25d8));
                    ::std::__cxx11::string::~string((string *)((long)&pvtex.contained + 0x25d8));
                  }
                  else {
                    value::Value::get_value<tinyusdz::UsdUVTexture>
                              (&oStack_15238,(Value *)&pUStack_18[1].spec,false);
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::
                    optional<tinyusdz::UsdUVTexture,_0>
                              ((optional<tinyusdz::UsdUVTexture> *)auStack_12c50,&oStack_15238);
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::~optional
                              (&oStack_15238);
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)auStack_12c50);
                    if (bVar1) {
                      this_09 = nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::value
                                          ((optional<tinyusdz::UsdUVTexture> *)auStack_12c50);
                      print_shader_params_abi_cxx11_
                                ((string *)((long)&pvtx2d.contained + 0x13a8),(tinyusdz *)this_09,
                                 (UsdUVTexture *)(ulong)(local_1c + 1),indent_00);
                      ::std::operator<<(aoStack_198,(string *)((long)&pvtx2d.contained + 0x13a8));
                      ::std::__cxx11::string::~string((string *)((long)&pvtx2d.contained + 0x13a8));
                    }
                    else {
                      value::Value::get_value<tinyusdz::UsdTransform2d>
                                (&oStack_179c8,(Value *)&pUStack_18[1].spec,false);
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::
                      optional<tinyusdz::UsdTransform2d,_0>
                                ((optional<tinyusdz::UsdTransform2d> *)auStack_16610,&oStack_179c8);
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::~optional
                                (&oStack_179c8);
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)auStack_16610);
                      if (bVar1) {
                        this_10 = nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::value
                                            ((optional<tinyusdz::UsdTransform2d> *)auStack_16610);
                        print_shader_params_abi_cxx11_
                                  ((string *)((long)&pvs.contained + 0x2f38),(tinyusdz *)this_10,
                                   (UsdTransform2d *)(ulong)(local_1c + 1),indent_00);
                        ::std::operator<<(aoStack_198,(string *)((long)&pvs.contained + 0x2f38));
                        ::std::__cxx11::string::~string((string *)((long)&pvs.contained + 0x2f38));
                      }
                      else {
                        value::Value::get_value<tinyusdz::UsdPreviewSurface>
                                  (&oStack_1d878,(Value *)&pUStack_18[1].spec,false);
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::
                        optional<tinyusdz::UsdPreviewSurface,_0>
                                  ((optional<tinyusdz::UsdPreviewSurface> *)auStack_1a930,
                                   &oStack_1d878);
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::~optional
                                  (&oStack_1d878);
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)auStack_1a930);
                        if (bVar1) {
                          this_11 = nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::
                                    value((optional<tinyusdz::UsdPreviewSurface> *)auStack_1a930);
                          print_shader_params_abi_cxx11_
                                    ((string *)((long)&pvsn.contained + 0x728),(tinyusdz *)this_11,
                                     (UsdPreviewSurface *)(ulong)(local_1c + 1),indent_00);
                          ::std::operator<<(aoStack_198,(string *)((long)&pvsn.contained + 0x728));
                          ::std::__cxx11::string::~string((string *)((long)&pvsn.contained + 0x728))
                          ;
                        }
                        else {
                          value::Value::get_value<tinyusdz::ShaderNode>
                                    (&oStack_1e708,(Value *)&pUStack_18[1].spec,false);
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::
                          optional<tinyusdz::ShaderNode,_0>
                                    ((optional<tinyusdz::ShaderNode> *)auStack_1dfd0,&oStack_1e708);
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::~optional
                                    (&oStack_1e708);
                          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                            ((optional *)auStack_1dfd0);
                          if (bVar1) {
                            this_12 = (tinyusdz *)
                                      nonstd::optional_lite::optional<tinyusdz::ShaderNode>::value
                                                ((optional<tinyusdz::ShaderNode> *)auStack_1dfd0);
                            print_common_shader_params_abi_cxx11_
                                      (&sStack_1e728,this_12,(ShaderNode *)(ulong)(local_1c + 1),
                                       indent_00);
                            ::std::operator<<(aoStack_198,(string *)&sStack_1e728);
                            ::std::__cxx11::string::~string((string *)&sStack_1e728);
                          }
                          else {
                            pprint::Indent_abi_cxx11_
                                      (&sStack_1e748,(pprint *)(ulong)(local_1c + 1),n_03);
                            poVar2 = ::std::operator<<(aoStack_198,(string *)&sStack_1e748);
                            ::std::operator<<(poVar2,"[???] Invalid ShaderNode in Shader Prim\n");
                            ::std::__cxx11::string::~string((string *)&sStack_1e748);
                          }
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::~optional
                                    ((optional<tinyusdz::ShaderNode> *)auStack_1dfd0);
                        }
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::~optional
                                  ((optional<tinyusdz::UsdPreviewSurface> *)auStack_1a930);
                      }
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::~optional
                                ((optional<tinyusdz::UsdTransform2d> *)auStack_16610);
                    }
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::~optional
                              ((optional<tinyusdz::UsdUVTexture> *)auStack_12c50);
                  }
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::~optional
                            ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             local_f780);
                }
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::~optional
                          ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           local_da48);
              }
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::~optional
                        ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         local_bd88);
            }
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::~optional((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                        local_a0c8);
          }
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~optional((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_83f0);
        }
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        ~optional((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)local_6710);
      }
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      ~optional((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)local_4a48);
    }
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::~optional
              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)local_2d88);
  }
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::~optional
            ((optional<tinyusdz::UsdPrimvarReader<float>_> *)local_10d0);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&sStack_1e768,(pprint *)(ulong)local_1c,n_04);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&sStack_1e768);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&sStack_1e768);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Shader &shader, const uint32_t indent,
                      bool closing_brace) {
  // generic Shader class
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(shader.spec) << " Shader \""
     << shader.name << "\"\n";
  if (shader.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(shader.metas(), indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (shader.info_id.size()) {
    ss << pprint::Indent(indent + 1) << "uniform token info:id = \""
       << shader.info_id << "\"\n";
  }

  if (auto pvr = shader.value.get_value<UsdPrimvarReader_float>()) {
    ss << print_shader_params(pvr.value(), indent + 1);
  } else if (auto pvr2 = shader.value.get_value<UsdPrimvarReader_float2>()) {
    ss << print_shader_params(pvr2.value(), indent + 1);
  } else if (auto pvr3 = shader.value.get_value<UsdPrimvarReader_float3>()) {
    ss << print_shader_params(pvr3.value(), indent + 1);
  } else if (auto pvr4 = shader.value.get_value<UsdPrimvarReader_float4>()) {
    ss << print_shader_params(pvr4.value(), indent + 1);
  } else if (auto pvrs = shader.value.get_value<UsdPrimvarReader_string>()) {
    ss << print_shader_params(pvrs.value(), indent + 1);
  } else if (auto pvrn = shader.value.get_value<UsdPrimvarReader_normal>()) {
    ss << print_shader_params(pvrn.value(), indent + 1);
  } else if (auto pvrv = shader.value.get_value<UsdPrimvarReader_vector>()) {
    ss << print_shader_params(pvrv.value(), indent + 1);
  } else if (auto pvrp = shader.value.get_value<UsdPrimvarReader_point>()) {
    ss << print_shader_params(pvrp.value(), indent + 1);
  } else if (auto pvrm = shader.value.get_value<UsdPrimvarReader_matrix>()) {
    ss << print_shader_params(pvrm.value(), indent + 1);
  } else if (auto pvtex = shader.value.get_value<UsdUVTexture>()) {
    ss << print_shader_params(pvtex.value(), indent + 1);
  } else if (auto pvtx2d = shader.value.get_value<UsdTransform2d>()) {
    ss << print_shader_params(pvtx2d.value(), indent + 1);
  } else if (auto pvs = shader.value.get_value<UsdPreviewSurface>()) {
    ss << print_shader_params(pvs.value(), indent + 1);
  } else if (auto pvsn = shader.value.get_value<ShaderNode>()) {
    // Generic ShaderNode
    ss << print_common_shader_params(pvsn.value(), indent + 1);
  } else {
    ss << pprint::Indent(indent + 1)
       << "[???] Invalid ShaderNode in Shader Prim\n";
  }

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}